

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_NodeAssignConst(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int fConst1)

{
  int iVar1;
  Ivy_FraigSim_t *pIVar2;
  int local_2c;
  int i;
  Ivy_FraigSim_t *pSims;
  int fConst1_local;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  iVar1 = Ivy_ObjIsPi(pObj);
  if (iVar1 != 0) {
    pIVar2 = Ivy_ObjSim(pObj);
    for (local_2c = 0; local_2c < p->nSimWords; local_2c = local_2c + 1) {
      iVar1 = 0;
      if (fConst1 != 0) {
        iVar1 = -1;
      }
      (&pIVar2[1].Type)[local_2c] = iVar1;
    }
    return;
  }
  __assert_fail("Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFraig.c"
                ,0x2c1,"void Ivy_NodeAssignConst(Ivy_FraigMan_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_NodeAssignConst( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int fConst1 )
{
    Ivy_FraigSim_t * pSims;
    int i;
    assert( Ivy_ObjIsPi(pObj) );
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        pSims->pData[i] = fConst1? ~(unsigned)0 : 0;
}